

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O2

char * upb_MdDecoder_DecodeBase92Varint
                 (upb_MdDecoder *d,char *ptr,char first_ch,uint8_t min,uint8_t max,uint32_t *out_val
                 )

{
  uint8_t *puVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  puVar1 = (uint8_t *)d->end;
  cVar2 = _upb_FromBase92(max);
  cVar3 = _upb_FromBase92(min);
  iVar6 = (int)cVar2 - (int)cVar3;
  uVar4 = iVar6 - 1;
  uVar7 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  iVar5 = (uVar7 ^ 0xffffffe0) + 0x21;
  uVar4 = 0;
  if (iVar6 < 2) {
    iVar5 = 0;
  }
  uVar7 = 0;
  while( true ) {
    cVar2 = _upb_FromBase92(first_ch);
    uVar4 = (int)cVar2 - (int)cVar3 << ((byte)uVar7 & 0x1f) | uVar4;
    if ((uint8_t *)ptr == puVar1) {
      *out_val = uVar4;
      if (puVar1 != (uint8_t *)0x0) {
        return (char *)puVar1;
      }
      __assert_fail("ptr != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/internal/base92.h"
                    ,0x30,
                    "const char *_upb_Base92_DecodeVarint(const char *, const char *, char, uint8_t, uint8_t, uint32_t *)"
                   );
    }
    first_ch = *ptr;
    if ((first_ch < (char)min) || ((char)max < first_ch)) break;
    ptr = (char *)((uint8_t *)ptr + 1);
    uVar7 = uVar7 + iVar5;
    if (0x1f < uVar7) {
      upb_MdDecoder_ErrorJmp(d,"Overlong varint");
    }
  }
  *out_val = uVar4;
  return (char *)(uint8_t *)ptr;
}

Assistant:

UPB_INLINE const char* upb_MdDecoder_DecodeBase92Varint(
    upb_MdDecoder* d, const char* ptr, char first_ch, uint8_t min, uint8_t max,
    uint32_t* out_val) {
  ptr = _upb_Base92_DecodeVarint(ptr, d->end, first_ch, min, max, out_val);
  if (!ptr) upb_MdDecoder_ErrorJmp(d, "Overlong varint");
  return ptr;
}